

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

copy_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
* __thiscall
mpark::detail::
copy_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
::operator=(copy_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
            *this,copy_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                  *that)

{
  copy_assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  *in_RDI;
  assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  assignment<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>
  ::
  generic_assign<mpark::detail::copy_assignment<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,(mpark::detail::Trait)1>const&>
            (unaff_retaddr,in_RDI);
  return in_RDI;
}

Assistant:

MPARK_VARIANT_COPY_ASSIGNMENT(
        Trait::Available,
        copy_assignment &operator=(const copy_assignment &that) {
          this->generic_assign(that);
          return *this;
        }